

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsFontScaler.cpp
# Opt level: O1

void __thiscall KDReports::FontScaler::setFactorForHeight(FontScaler *this,qreal wantedHeight)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int in_ESI;
  bool bVar4;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  
  if (wantedHeight <= 0.0) {
    setFactorForHeight();
    dVar6 = (double)QFontMetricsF::size((int)this + 0x18,(QString *)0x100,in_ESI,(int *)0x0);
    iVar1 = (int)this + 0x10;
    dVar5 = (double)QFontMetricsF::size(iVar1,(QString *)0x100,in_ESI,(int *)0x0);
    uVar3 = 0;
    do {
      dVar7 = dVar5;
      if (dVar7 <= dVar6 * extraout_XMM0_Qa) {
        return;
      }
      applyAdditionalScalingFactor(this,(dVar6 * extraout_XMM0_Qa) / dVar7);
      dVar5 = (double)QFontMetricsF::size(iVar1,(QString *)0x100,in_ESI,(int *)0x0);
      uVar2 = uVar3 + 1;
      bVar4 = uVar3 < 10;
      uVar3 = uVar2;
    } while (((bVar4) || (dVar5 != dVar7)) || (NAN(dVar5) || NAN(dVar7)));
    return;
  }
  dVar5 = (double)QFontMetricsF::height();
  uVar3 = 0;
  while( true ) {
    if (dVar5 <= wantedHeight) {
      return;
    }
    if (dVar5 <= 3.0) break;
    applyAdditionalScalingFactor(this,wantedHeight / dVar5);
    dVar6 = (double)QFontMetricsF::height();
    if (9 < uVar3) {
      if ((dVar6 == dVar5) && (!NAN(dVar6) && !NAN(dVar5))) {
        return;
      }
    }
    uVar3 = uVar3 + 1;
    iVar1 = QFont::pixelSize();
    dVar5 = dVar6;
    if (iVar1 == 1) {
      return;
    }
  }
  return;
}

Assistant:

void FontScaler::setFactorForHeight(qreal wantedHeight)
{
#ifdef DEBUG_LAYOUT
    qDebug() << " FontScaler::setFactorForHeight" << wantedHeight;
#endif
    Q_ASSERT(wantedHeight > 0);
    qreal height = m_fontMetrics.height();
    int iterations = 0;

    while (height > wantedHeight && height > 3.0 /* seems to be the min we can get */) {
        const qreal factor = wantedHeight / height;
        applyAdditionalScalingFactor(factor);
        qreal prevHeight = height;
        height = m_fontMetrics.height();
#ifdef DEBUG_LAYOUT
        qDebug() << " FontScaler: height=" << height << factor << m_scalingFactor;
#endif
        if (++iterations > 10 && height == prevHeight) {
            // We're not getting anywhere, probably we're hitting a minimum width when
            // trying to use a very, very small font (see unittest testFontScalerVerySmall)
            break;
        }
        if (m_font.pixelSize() == 1) {
            break;
        }
    }
}